

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O0

int hdr_decode_compressed(uint8_t *buffer,size_t length,hdr_histogram **histogram)

{
  __uint32_t cookie;
  uint32_t uVar1;
  compression_flyweight_t *compression_flyweight;
  uint32_t compression_cookie;
  hdr_histogram **histogram_local;
  size_t length_local;
  uint8_t *buffer_local;
  
  if (length < 8) {
    buffer_local._4_4_ = 0x16;
  }
  else {
    cookie = __bswap_32(*(__uint32_t *)buffer);
    uVar1 = get_cookie_base(cookie);
    if (uVar1 == 0x1c849309) {
      buffer_local._4_4_ =
           hdr_decode_compressed_v0((compression_flyweight_t *)buffer,length,histogram);
    }
    else if (uVar1 == 0x1c849302) {
      buffer_local._4_4_ =
           hdr_decode_compressed_v1((compression_flyweight_t *)buffer,length,histogram);
    }
    else if (uVar1 == 0x1c849304) {
      buffer_local._4_4_ =
           hdr_decode_compressed_v2((compression_flyweight_t *)buffer,length,histogram);
    }
    else {
      buffer_local._4_4_ = -29999;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int hdr_decode_compressed(
    uint8_t* buffer, size_t length, struct hdr_histogram** histogram)
{
    uint32_t compression_cookie;
    compression_flyweight_t* compression_flyweight;

    if (length < SIZEOF_COMPRESSION_FLYWEIGHT)
    {
        return EINVAL;
    }

    compression_flyweight = (compression_flyweight_t*) buffer;

    compression_cookie = get_cookie_base(be32toh(compression_flyweight->cookie));
    if (V0_COMPRESSION_COOKIE == compression_cookie)
    {
        return hdr_decode_compressed_v0(compression_flyweight, length, histogram);
    }
    else if (V1_COMPRESSION_COOKIE == compression_cookie)
    {
        return hdr_decode_compressed_v1(compression_flyweight, length, histogram);
    }
    else if (V2_COMPRESSION_COOKIE == compression_cookie)
    {
        return hdr_decode_compressed_v2(compression_flyweight, length, histogram);
    }

    return HDR_COMPRESSION_COOKIE_MISMATCH;
}